

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteSpherical.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkRevoluteSpherical::IntLoadConstraint_C
          (ChLinkRevoluteSpherical *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  ulong uVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  undefined1 auVar5 [16];
  int iVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  undefined8 in_XMM1_Qb;
  undefined1 auVar12 [16];
  
  uVar4 = (ulong)off_L;
  iVar6 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar6 == '\0') {
    return;
  }
  dVar9 = (this->m_cur_dist - this->m_dist) * c;
  if (do_clamp) {
    auVar5._8_8_ = in_XMM1_Qb;
    auVar5._0_8_ = recovery_clamp;
    auVar3._8_8_ = 0x8000000000000000;
    auVar3._0_8_ = 0x8000000000000000;
    auVar8 = vxorpd_avx512vl(auVar5,auVar3);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar9;
    auVar3 = vmaxsd_avx(auVar10,auVar8);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = c * this->m_cur_dot;
    auVar8 = vmaxsd_avx(auVar12,auVar8);
    auVar3 = vminsd_avx(auVar3,auVar5);
    dVar9 = auVar3._0_8_;
    auVar3 = vminsd_avx(auVar8,auVar5);
    dVar11 = auVar3._0_8_;
  }
  else {
    dVar11 = c * this->m_cur_dot;
  }
  uVar1 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)uVar4 < (long)uVar1) {
    pdVar2 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    uVar7 = (ulong)(off_L + 1);
    pdVar2[uVar4] = dVar9 + pdVar2[uVar4];
    if (uVar7 < uVar1) {
      pdVar2[uVar7] = dVar11 + pdVar2[uVar7];
      return;
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChLinkRevoluteSpherical::IntLoadConstraint_C(const unsigned int off_L,  ///< offset in Qc residual
                                                  ChVectorDynamic<>& Qc,     ///< result: the Qc residual, Qc += c*C
                                                  const double c,            ///< a scaling factor
                                                  bool do_clamp,             ///< apply clamping to c*C?
                                                  double recovery_clamp      ///< value for min/max clamping of c*C
                                                  ) {
    if (!IsActive())
        return;

    double cnstr_dist_violation =
        do_clamp ? ChMin(ChMax(c * (m_cur_dist - m_dist), -recovery_clamp), recovery_clamp) : c * (m_cur_dist - m_dist);

    double cnstr_dot_violation =
        do_clamp ? ChMin(ChMax(c * m_cur_dot, -recovery_clamp), recovery_clamp) : c * m_cur_dot;

    Qc(off_L + 0) += cnstr_dist_violation;
    Qc(off_L + 1) += cnstr_dot_violation;
}